

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O2

void __thiscall
soplex::SPxLPBase<double>::changeLower(SPxLPBase<double> *this,int i,double *newLower,bool scale)

{
  double *pdVar1;
  undefined7 in_register_00000009;
  double extraout_XMM0_Qa;
  double dVar2;
  
  if ((int)CONCAT71(in_register_00000009,scale) != 0) {
    dVar2 = *newLower;
    pdVar1 = (double *)infinity();
    if (-*pdVar1 < dVar2) {
      (*this->lp_scaler->_vptr_SPxScaler[0x2b])(*newLower,this->lp_scaler,this,i);
      dVar2 = extraout_XMM0_Qa;
      goto LAB_00192da5;
    }
  }
  dVar2 = *newLower;
LAB_00192da5:
  (this->super_LPColSetBase<double>).low.val.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_start[i] = dVar2;
  return;
}

Assistant:

virtual void changeLower(int i, const R& newLower, bool scale = false)
   {
      if(scale && newLower > R(-infinity))
      {
         assert(_isScaled);
         assert(lp_scaler);
         LPColSetBase<R>::lower_w(i) = lp_scaler->scaleLower(*this, i, newLower);
      }
      else
         LPColSetBase<R>::lower_w(i) = newLower;

      assert(isConsistent());
   }